

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O2

int mbedtls_pk_parse_public_keyfile(mbedtls_pk_context *ctx,char *path)

{
  int iVar1;
  uchar *buf;
  size_t n;
  uchar *local_28;
  size_t local_20;
  
  iVar1 = mbedtls_pk_load_file(path,&local_28,&local_20);
  if (iVar1 == 0) {
    iVar1 = mbedtls_pk_parse_public_key(ctx,local_28,local_20);
    mbedtls_zeroize(local_28,local_20);
    free(local_28);
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_public_keyfile( mbedtls_pk_context *ctx, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = mbedtls_pk_load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_pk_parse_public_key( ctx, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}